

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::Statistics::~Statistics(Statistics *this)

{
  SolverStats *this_00;
  ulong uVar1;
  void *pvVar2;
  
  if (this->clingo_ != (ClingoView *)0x0) {
    (*(this->clingo_->super_ClaspStatistics).super_AbstractStatistics._vptr_AbstractStatistics[1])()
    ;
  }
  this_00 = (this->solvers_).multi;
  if (this_00 != (SolverStats *)0x0) {
    SolverStats::~SolverStats(this_00);
  }
  operator_delete(this_00);
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::~StatsVec(&this->accu_);
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::~StatsVec(&this->solver_);
  SolverStats::~SolverStats(&this->solvers_);
  uVar1 = (this->lp_).ptr_;
  pvVar2 = (void *)(uVar1 & 0xfffffffffffffffe);
  if ((uVar1 & 1) != 0 && pvVar2 != (void *)0x0) {
    (this->lp_).ptr_ = (uintp)pvVar2;
    operator_delete(pvVar2);
  }
  (this->lp_).ptr_ = 1;
  return;
}

Assistant:

~Statistics() { delete clingo_; delete solvers_.multi; }